

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

void CLI::detail::format_help(stringstream *out,string *name,string *description,size_t wid)

{
  _Setw _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar2;
  ostream *poVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t wid_local;
  string *description_local;
  string *name_local;
  stringstream *out_local;
  
  local_28 = wid;
  wid_local = (size_t)description;
  description_local = name;
  name_local = (string *)out;
  ::std::operator+(&local_48,"  ",name);
  ::std::__cxx11::string::operator=((string *)name,(string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  paVar2 = &name_local->field_2;
  _Var1 = std::setw((int)local_28);
  poVar3 = ::std::operator<<((ostream *)paVar2->_M_local_buf,_Var1);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
  ::std::operator<<(poVar3,(string *)name);
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    uVar4 = ::std::__cxx11::string::length();
    if (local_28 <= uVar4) {
      poVar3 = (ostream *)
               ::std::ostream::operator<<
                         (&name_local->field_2,::std::endl<char,std::char_traits<char>>);
      _Var1 = std::setw((int)local_28);
      poVar3 = ::std::operator<<(poVar3,_Var1);
      ::std::operator<<(poVar3,"");
    }
    ::std::operator<<((ostream *)(name_local->field_2)._M_local_buf,(string *)description);
  }
  ::std::ostream::operator<<(&name_local->field_2,::std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void format_help(std::stringstream &out, std::string name, std::string description, size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << std::endl << std::setw(static_cast<int>(wid)) << "";
        out << description;
    }
    out << std::endl;
}